

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O0

int ClientCertCallback(SSL *ssl,X509 **out_x509,EVP_PKEY **out_pkey)

{
  bool bVar1;
  TestConfig *pTVar2;
  TestState *pTVar3;
  pointer pxVar4;
  pointer peVar5;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_40;
  UniquePtr<EVP_PKEY> pkey;
  UniquePtr<struct_stack_st_X509> chain;
  UniquePtr<X509> x509;
  EVP_PKEY **out_pkey_local;
  X509 **out_x509_local;
  SSL *ssl_local;
  
  bVar1 = CheckCertificateRequest(ssl);
  if (bVar1) {
    pTVar2 = GetTestConfig(ssl);
    if (((pTVar2->async & 1U) != 0) && (pTVar3 = GetTestState(ssl), (pTVar3->cert_ready & 1U) == 0))
    {
      return -1;
    }
    std::unique_ptr<x509_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<x509_st,bssl::internal::Deleter> *)&chain);
    std::unique_ptr<stack_st_X509,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<stack_st_X509,bssl::internal::Deleter> *)&pkey);
    std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)&local_40);
    bVar1 = GetCertificate(ssl,(UniquePtr<X509> *)&chain,(UniquePtr<struct_stack_st_X509> *)&pkey,
                           (UniquePtr<EVP_PKEY> *)&local_40);
    if (bVar1) {
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&chain);
      if (bVar1) {
        pxVar4 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::release
                           ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&chain);
        *out_x509 = pxVar4;
        peVar5 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::release(&local_40);
        *out_pkey = peVar5;
        ssl_local._4_4_ = 1;
      }
      else {
        ssl_local._4_4_ = 0;
      }
    }
    else {
      ssl_local._4_4_ = -1;
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_40);
    std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&pkey);
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&chain);
  }
  else {
    ssl_local._4_4_ = -1;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ClientCertCallback(SSL *ssl, X509 **out_x509, EVP_PKEY **out_pkey) {
  if (!CheckCertificateRequest(ssl)) {
    return -1;
  }

  if (GetTestConfig(ssl)->async && !GetTestState(ssl)->cert_ready) {
    return -1;
  }

  bssl::UniquePtr<X509> x509;
  bssl::UniquePtr<STACK_OF(X509)> chain;
  bssl::UniquePtr<EVP_PKEY> pkey;
  if (!GetCertificate(ssl, &x509, &chain, &pkey)) {
    return -1;
  }

  // Return zero for no certificate.
  if (!x509) {
    return 0;
  }

  // Chains and asynchronous private keys are not supported with client_cert_cb.
  *out_x509 = x509.release();
  *out_pkey = pkey.release();
  return 1;
}